

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O3

void __thiscall
QtMWidgets::NavigationArrow::NavigationArrow
          (NavigationArrow *this,Direction direction,QWidget *parent)

{
  NavigationArrowPrivate *this_00;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00197a08;
  *(undefined ***)&this->field_0x10 = &PTR__NavigationArrow_00197bb8;
  this_00 = (NavigationArrowPrivate *)operator_new(0x40);
  this_00->q = this;
  this_00->direction = direction;
  (this_00->color).cspec = Invalid;
  (this_00->color).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->color).ct + 2) = 0;
  (this_00->baseColor).cspec = Invalid;
  (this_00->baseColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->baseColor).ct + 2) = 0;
  this_00->leftButtonPressed = false;
  (this->d).d = this_00;
  NavigationArrowPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

NavigationArrow::NavigationArrow( Direction direction, QWidget * parent )
	:	QWidget( parent )
	,	d( new NavigationArrowPrivate( direction, this ) )
{
	d->init();
}